

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

bool __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::Add(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
      *this,JavascriptPromise *key,int data)

{
  uint targetBucket_00;
  EntryType *pEVar1;
  uint targetBucket;
  int data_local;
  JavascriptPromise *key_local;
  SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
  *this_local;
  
  targetBucket_00 = HashKeyToBucket(this,key);
  pEVar1 = FindEntry(this,key,targetBucket_00);
  if (pEVar1 == (EntryType *)0x0) {
    AddInternal(this,key,data,targetBucket_00);
  }
  return pEVar1 == (EntryType *)0x0;
}

Assistant:

bool Add(TKey key, TData data)
    {
        uint targetBucket = HashKeyToBucket(key);

        if(FindEntry(key, targetBucket) != nullptr)
        {
            return false;
        }

        AddInternal(key, data, targetBucket);
        return true;
    }